

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_error adios2_remove_attribute(adios2_bool *result,adios2_io *io,char *name)

{
  byte bVar1;
  adios2_io *in_RDX;
  string *in_RSI;
  uint *in_RDI;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for adios2_io, in call to adios2_remove_attribute",&local_41);
  adios2::helper::CheckForNullptr<adios2_io>(in_RDX,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,(char *)in_RDX,&local_79);
  bVar1 = adios2::core::IO::RemoveAttribute(in_RSI);
  *in_RDI = (uint)((bVar1 & 1) != 0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_remove_attribute(adios2_bool *result, adios2_io *io, const char *name)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_remove_attribute");
        *result = reinterpret_cast<adios2::core::IO *>(io)->RemoveAttribute(name) ? adios2_true
                                                                                  : adios2_false;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_remove_attribute"));
    }
}